

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

ostream * __thiscall
tcu::Format::Enum<vk::VkVertexInputRate,_4UL>::toStream
          (Enum<vk::VkVertexInputRate,_4UL> *this,ostream *stream)

{
  char *__s;
  size_t sVar1;
  Hex<8UL> local_20;
  
  __s = (*this->m_getName)(this->m_value);
  if (__s == (char *)0x0) {
    local_20.value = (deUint64)this->m_value;
    stream = Hex<8UL>::toStream(&local_20,stream);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
  }
  return stream;
}

Assistant:

std::ostream& toStream (std::ostream& stream) const
	{
		const char* name = m_getName(m_value);
		if (name)
			return stream << name;
		else
			return stream << Hex<NumBytes*2>((deUint64)m_value);
	}